

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void temp_free_or_dead(TCGContext_conflict9 *s,TCGTemp *ts,int free_or_dead)

{
  uint uVar1;
  bool bVar2;
  int free_or_dead_local;
  TCGTemp *ts_local;
  TCGContext_conflict9 *s_local;
  
  if ((*(ulong *)ts >> 0x20 & 1) == 0) {
    if (((uint)((ulong)*(undefined8 *)ts >> 8) & 0xff) == 1) {
      s->reg_to_temp[(uint)*(undefined8 *)ts & 0xff] = (TCGTemp *)0x0;
    }
    bVar2 = true;
    if ((-1 < free_or_dead) && (bVar2 = true, ((uint)((ulong)*(undefined8 *)ts >> 0x26) & 1) == 0))
    {
      bVar2 = (*(ulong *)ts >> 0x25 & 1) != 0;
    }
    uVar1 = 0;
    if (bVar2) {
      uVar1 = 2;
    }
    *(ulong *)ts = *(ulong *)ts & 0xffffffffffff00ff | (ulong)uVar1 << 8;
  }
  return;
}

Assistant:

static void temp_free_or_dead(TCGContext *s, TCGTemp *ts, int free_or_dead)
{
    if (ts->fixed_reg) {
        return;
    }
    if (ts->val_type == TEMP_VAL_REG) {
        s->reg_to_temp[ts->reg] = NULL;
    }
    ts->val_type = (free_or_dead < 0
                    || ts->temp_local
                    || ts->temp_global
                    ? TEMP_VAL_MEM : TEMP_VAL_DEAD);
}